

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void * ecs_get_w_entity(ecs_world_t *world,ecs_entity_t entity,ecs_entity_t component)

{
  _Bool _Var1;
  void *pvStack_58;
  _Bool found;
  void *ptr;
  ecs_entity_info_t info;
  ecs_stage_t *stage;
  ecs_entity_t component_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  entity_local = (ecs_entity_t)world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x7d7);
  if (entity_local == 0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x7d7,"const void *ecs_get_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t)");
  }
  info._24_8_ = ecs_get_stage((ecs_world_t **)&entity_local);
  pvStack_58 = (void *)0x0;
  _ecs_assert(*(int *)entity_local == 0x65637377,0xc,(char *)0x0,"world->magic == ECS_WORLD_MAGIC",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x7dc);
  if (*(int *)entity_local == 0x65637377) {
    _Var1 = ecs_get_info((ecs_world_t *)entity_local,entity,(ecs_entity_info_t *)&ptr);
    if (_Var1) {
      if (info.record == (ecs_record_t *)0x0) {
        return (void *)0x0;
      }
      pvStack_58 = get_component((ecs_entity_info_t *)&ptr,component);
      if (((pvStack_58 == (void *)0x0) && (component != 6)) && (component != 0x101)) {
        pvStack_58 = get_base_component((ecs_world_t *)entity_local,(ecs_stage_t *)info._24_8_,
                                        (ecs_entity_info_t *)&ptr,component);
      }
    }
    return pvStack_58;
  }
  __assert_fail("world->magic == (0x65637377)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x7dc,"const void *ecs_get_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t)");
}

Assistant:

const void* ecs_get_w_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entity_t component)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_entity_info_t info;
    void *ptr = NULL;

    ecs_assert(world->magic == ECS_WORLD_MAGIC, ECS_INTERNAL_ERROR, NULL);

    bool found = ecs_get_info(world, entity, &info);
    if (found) {
        if (!info.table) {
            return NULL;
        }

        ptr = get_component(&info, component);
        if (!ptr) {
            if (component != ecs_typeid(EcsName) && component != EcsPrefab) {
                ptr = get_base_component(
                    world, stage, &info, component);
            }
        }        
    }

    return ptr;
}